

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
__thiscall duckdb::GetBaseStatsUnifier(duckdb *this,LogicalType *type)

{
  PhysicalType PVar1;
  undefined *puVar2;
  uint8_t scale;
  uint8_t width;
  uint8_t local_1a;
  uint8_t local_19;
  undefined8 *local_18;
  
  switch(type->id_) {
  default:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NullStatsUnifier::vtable;
    break;
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case UTINYINT:
  case USMALLINT:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<int>::vtable;
    break;
  case BIGINT:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<long>::vtable;
    break;
  case DATE:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::date_t>::vtable;
    break;
  case TIME:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::dtime_t>::vtable;
    break;
  case TIMESTAMP_SEC:
  case TIMESTAMP:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_t>::vtable;
    break;
  case TIMESTAMP_MS:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_ms_t>::vtable;
    break;
  case TIMESTAMP_NS:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_ns_t>::vtable;
    break;
  case DECIMAL:
    local_19 = DecimalType::GetWidth(type);
    local_1a = DecimalType::GetScale(type);
    PVar1 = type->physical_type_;
    if (PVar1 != INT16) {
      if (PVar1 == INT64) {
        make_uniq<duckdb::DecimalStatsUnifier<long>,unsigned_char&,unsigned_char&>
                  ((duckdb *)&local_18,&local_19,&local_1a);
        goto LAB_01c85a14;
      }
      if (PVar1 != INT32) {
        make_uniq<duckdb::NullStatsUnifier>();
        goto LAB_01c85a14;
      }
    }
    make_uniq<duckdb::DecimalStatsUnifier<int>,unsigned_char&,unsigned_char&>
              ((duckdb *)&local_18,&local_19,&local_1a);
    goto LAB_01c85a14;
  case FLOAT:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<float>::vtable;
    break;
  case DOUBLE:
  case UHUGEINT:
  case HUGEINT:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<double>::vtable;
    break;
  case VARCHAR:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &StringStatsUnifier::vtable;
    break;
  case BLOB:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &BlobStatsUnifier::vtable;
    break;
  case UINTEGER:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<unsigned_int>::vtable;
    break;
  case UBIGINT:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<unsigned_long>::vtable;
    break;
  case TIMESTAMP_TZ:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::timestamp_tz_t>::vtable;
    break;
  case TIME_TZ:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &NumericStatsUnifier<duckdb::dtime_tz_t>::vtable;
    break;
  case UUID:
    local_18 = (undefined8 *)operator_new(0x88);
    local_18[4] = 0;
    local_18[5] = 0;
    local_18[8] = 0;
    local_18[9] = 0;
    local_18[0xe] = 0;
    local_18[0xf] = 0;
    local_18[2] = 0;
    local_18[3] = 0;
    local_18[6] = 0;
    local_18[7] = 0;
    local_18[10] = 0;
    local_18[0xb] = 0;
    local_18[0xc] = 0;
    local_18[0xd] = 0;
    local_18[0x10] = 0;
    local_18[1] = local_18 + 3;
    local_18[5] = local_18 + 7;
    local_18[9] = local_18 + 0xb;
    *(undefined2 *)(local_18 + 0xe) = 0x101;
    *(undefined1 *)(local_18 + 0x10) = 0;
    puVar2 = &UUIDStatsUnifier::vtable;
  }
  *local_18 = puVar2 + 0x10;
LAB_01c85a14:
  *(undefined8 **)this = local_18;
  return (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         this;
}

Assistant:

unique_ptr<ColumnStatsUnifier> GetBaseStatsUnifier(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<NullStatsUnifier>();
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
		return make_uniq<NumericStatsUnifier<int32_t>>();
	case LogicalTypeId::DATE:
		return make_uniq<NumericStatsUnifier<date_t>>();
	case LogicalTypeId::BIGINT:
		return make_uniq<NumericStatsUnifier<int64_t>>();
	case LogicalTypeId::TIME:
		return make_uniq<NumericStatsUnifier<dtime_t>>();
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP:
		return make_uniq<NumericStatsUnifier<timestamp_t>>();
	case LogicalTypeId::TIMESTAMP_TZ:
		return make_uniq<NumericStatsUnifier<timestamp_tz_t>>();
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<NumericStatsUnifier<timestamp_ms_t>>();
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<NumericStatsUnifier<timestamp_ns_t>>();
	case LogicalTypeId::TIME_TZ:
		return make_uniq<NumericStatsUnifier<dtime_tz_t>>();
	case LogicalTypeId::UINTEGER:
		return make_uniq<NumericStatsUnifier<uint32_t>>();
	case LogicalTypeId::UBIGINT:
		return make_uniq<NumericStatsUnifier<uint64_t>>();
	case LogicalTypeId::FLOAT:
		return make_uniq<NumericStatsUnifier<float>>();
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::DOUBLE:
		return make_uniq<NumericStatsUnifier<double>>();
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
		case PhysicalType::INT32:
			return make_uniq<DecimalStatsUnifier<int32_t>>(width, scale);
		case PhysicalType::INT64:
			return make_uniq<DecimalStatsUnifier<int64_t>>(width, scale);
		default:
			return make_uniq<NullStatsUnifier>();
		}
	}
	case LogicalTypeId::BLOB:
		return make_uniq<BlobStatsUnifier>();
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringStatsUnifier>();
	case LogicalTypeId::UUID:
		return make_uniq<UUIDStatsUnifier>();
	case LogicalTypeId::INTERVAL:;
	case LogicalTypeId::ENUM:
	default:
		return make_uniq<NullStatsUnifier>();
	}
}